

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O3

float __thiscall LumaQuantizer::dequantize(LumaQuantizer *this,float val,uint ch)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if ((ch == 0) || ((this->m_colorSpace | CS_YCBCR) == CS_XYZ)) {
    if (0.0 <= val) {
      uVar1 = (ulong)this->m_maxVal;
      if (val < (float)uVar1) {
        uVar1 = (ulong)(int)val;
      }
      fVar3 = this->m_mapping[uVar1];
    }
    else {
      fVar3 = *this->m_mapping;
    }
  }
  else {
    fVar2 = val / (float)this->m_maxValColor;
    fVar3 = 1e-10;
    if (1e-10 <= fVar2) {
      fVar3 = fVar2;
    }
  }
  return fVar3;
}

Assistant:

float LumaQuantizer::dequantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {	
	    if( val < 0 )
		    res = m_mapping[0];
	    else if( val >= m_maxVal )
		    res = m_mapping[m_maxVal];
	    else
		    res = m_mapping[(int)val];	
    }
    else
        res = std::max(val/m_maxValColor, 1e-10f);    
    
	return res;
}